

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3d.h
# Opt level: O1

vector3d<float> __thiscall
irr::core::vector3d<float>::rotationToDirection(vector3d<float> *this,vector3d<float> *forwards)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  vector3d<float> vVar10;
  
  dVar1 = cos((double)this->X * 0.017453292519943295);
  dVar2 = sin((double)this->X * 0.017453292519943295);
  dVar3 = cos((double)this->Y * 0.017453292519943295);
  dVar4 = sin((double)this->Y * 0.017453292519943295);
  dVar5 = cos((double)this->Z * 0.017453292519943295);
  dVar6 = sin((double)this->Z * 0.017453292519943295);
  dVar7 = (double)forwards->X;
  dVar9 = (double)forwards->Y;
  dVar8 = (double)forwards->Z;
  vVar10.X = (float)(dVar8 * (dVar1 * dVar4 * dVar5 + dVar6 * dVar2) +
                    dVar7 * dVar3 * dVar5 + dVar9 * (dVar2 * dVar4 * dVar5 + -dVar1 * dVar6));
  vVar10.Y = (float)(dVar8 * (dVar1 * dVar4 * dVar6 + -dVar2 * dVar5) +
                    dVar7 * dVar3 * dVar6 + dVar9 * (dVar2 * dVar4 * dVar6 + dVar5 * dVar1));
  vVar10.Z = (float)(dVar1 * dVar3 * dVar8 + (dVar2 * dVar3 * dVar9 - dVar7 * dVar4));
  return vVar10;
}

Assistant:

vector3d<T> rotationToDirection(const vector3d<T> &forwards = vector3d<T>(0, 0, 1)) const
	{
		const f64 cr = cos(core::DEGTORAD64 * X);
		const f64 sr = sin(core::DEGTORAD64 * X);
		const f64 cp = cos(core::DEGTORAD64 * Y);
		const f64 sp = sin(core::DEGTORAD64 * Y);
		const f64 cy = cos(core::DEGTORAD64 * Z);
		const f64 sy = sin(core::DEGTORAD64 * Z);

		const f64 srsp = sr * sp;
		const f64 crsp = cr * sp;

		const f64 pseudoMatrix[] = {
				(cp * cy), (cp * sy), (-sp),
				(srsp * cy - cr * sy), (srsp * sy + cr * cy), (sr * cp),
				(crsp * cy + sr * sy), (crsp * sy - sr * cy), (cr * cp)};

		return vector3d<T>(
				(T)(forwards.X * pseudoMatrix[0] +
						forwards.Y * pseudoMatrix[3] +
						forwards.Z * pseudoMatrix[6]),
				(T)(forwards.X * pseudoMatrix[1] +
						forwards.Y * pseudoMatrix[4] +
						forwards.Z * pseudoMatrix[7]),
				(T)(forwards.X * pseudoMatrix[2] +
						forwards.Y * pseudoMatrix[5] +
						forwards.Z * pseudoMatrix[8]));
	}